

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O3

void __thiscall Lista<Lista<int>_>::eliminar(Lista<Lista<int>_> *this,Nat i)

{
  Nodo *pNVar1;
  Nodo *pNVar2;
  Lista<Lista<int>_> *pLVar3;
  Nodo **ppNVar4;
  Nodo *this_00;
  
  this_00 = this->_prim;
  if (i != 0) {
    do {
      this_00 = this_00->_sig;
      i = i - 1;
    } while (i != 0);
  }
  pNVar1 = this_00->_sig;
  pNVar2 = this_00->_ant;
  Lista<int>::eliminarTodos(&this_00->_valor);
  operator_delete(this_00);
  pLVar3 = (Lista<Lista<int>_> *)&pNVar2->_sig;
  if (pNVar2 == (Nodo *)0x0) {
    pLVar3 = this;
  }
  pLVar3->_prim = pNVar1;
  ppNVar4 = &this->_ult;
  if (pNVar1 != (Nodo *)0x0) {
    ppNVar4 = &pNVar1->_ant;
  }
  *ppNVar4 = pNVar2;
  return;
}

Assistant:

void Lista<T>::eliminar(Nat i) {
    Nodo *pNodo = this->iesimoNodo(i);
    Nodo *ant = pNodo->_ant;
    Nodo *sig = pNodo->_sig;

    delete pNodo;
    if(ant == nullptr) {
        this->_prim = sig;
    } else {
        ant->_sig = sig;
    }

    if(sig == nullptr) {
        this->_ult = ant;
    } else {
        sig->_ant = ant;
    }
}